

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O1

QList<QByteArray> * __thiscall
QObject::dynamicPropertyNames(QList<QByteArray> *__return_storage_ptr__,QObject *this)

{
  _func_int **pp_Var1;
  Data *pDVar2;
  
  pp_Var1 = (this->d_ptr).d[1]._vptr_QObjectData;
  if (pp_Var1 == (_func_int **)0x0) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (QByteArray *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    pDVar2 = (Data *)*pp_Var1;
    (__return_storage_ptr__->d).d = pDVar2;
    (__return_storage_ptr__->d).ptr = (QByteArray *)pp_Var1[1];
    (__return_storage_ptr__->d).size = (qsizetype)pp_Var1[2];
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      return __return_storage_ptr__;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QList<QByteArray> QObject::dynamicPropertyNames() const
{
    Q_D(const QObject);
    if (d->extraData)
        return d->extraData->propertyNames;
    return QList<QByteArray>();
}